

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-client.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  unsigned_long uVar4;
  bool bVar5;
  unsigned_long local_1160;
  unsigned_long last;
  char ca_path [1024];
  char key_path [1024];
  char cert_path [1024];
  char path [300];
  char *local_420;
  char *p;
  char *prot;
  lws_context *context;
  lws_client_connect_info i;
  lws_context_creation_info info;
  uint do_multi;
  uint pp_secs;
  uint do_ws;
  uint rl_mirror;
  uint rl_dumb;
  int ietf_version;
  int use_ssl;
  int port;
  int ret;
  int m;
  int n;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ret = 0;
  use_ssl = 0;
  ietf_version = 0x1e01;
  rl_dumb = 0;
  rl_mirror = 0xffffffff;
  do_ws = 0;
  pp_secs = 0;
  bVar1 = false;
  _m = argv;
  argv_local._0_4_ = argc;
  memset(key_path + 0x3f8,0,0x400);
  memset(ca_path + 0x3f8,0,0x400);
  memset(&last,0,0x400);
  local_1160 = lws_now_secs();
  memset(i._unused + 3,0,0x2e0);
  _lws_log(4,"libwebsockets test client - license MIT\n");
  _lws_log(4,"(C) Copyright 2010-2018 Andy Green <andy@warmcat.com>\n");
  if (1 < (int)argv_local) {
    while (-1 < ret) {
      ret = getopt_long((int)argv_local,_m,"Sjnuv:hsp:d:lC:K:A:P:moeO",options,0);
      if (-1 < ret) {
        if (ret - 0x41U < 0x35 || ret == 0x76) {
          switch((long)&switchD_0010c08b::switchdataD_00155004 +
                 (long)(int)(&switchD_0010c08b::switchdataD_00155004)[ret - 0x41U]) {
          case 0x10c08d:
            iVar3 = atoi(_optarg);
            lws_set_log_level(iVar3,(_func_void_int_char_ptr *)0x0);
            break;
          case 0x10c0ac:
            rl_dumb = 7;
            break;
          case 0x10c0b8:
            rl_dumb = 1;
            break;
          case 0x10c0c4:
            ietf_version = atoi(_optarg);
            break;
          case 0x10c0db:
            flag_echo = 1;
            break;
          case 0x10c0ea:
            uVar2 = atoi(_optarg);
            _lws_log(4,"Setting pingpong interval to %d\n",(ulong)uVar2);
            break;
          case 0x10c117:
            justmirror = 1;
            break;
          case 0x10c126:
            longlived = 1;
            break;
          case 0x10c135:
            rl_mirror = atoi(_optarg);
            break;
          case 0x10c14c:
            deny_deflate = 1;
            break;
          case 0x10c15b:
            bVar1 = true;
            break;
          case 0x10c167:
            test_post = 1;
            break;
          case 0x10c176:
            once = 1;
            break;
          case 0x10c185:
            flag_no_mirror_traffic = 1;
            _lws_log(4,"Disabled sending mirror data (for pingpong testing)\n");
            break;
          case 0x10c1a4:
            lws_strncpy(key_path + 0x3f8,_optarg,0x400);
            break;
          case 0x10c1c1:
            lws_strncpy(ca_path + 0x3f8,_optarg,0x400);
            break;
          case 0x10c1de:
            lws_strncpy((char *)&last,_optarg,0x400);
            break;
          case 0x10c1fb:
            lws_strncpy(crl_path,_optarg,0x400);
            break;
          case 0x10c218:
            goto LAB_0010c942;
          }
        }
      }
    }
    if (_optind < (int)argv_local) {
      signal(2,sighandler);
      memset(&context,0,0xe0);
      i.address._0_4_ = ietf_version;
      iVar3 = lws_parse_uri(_m[_optind],&p,(char **)&i,(int *)&i.address,&local_420);
      if (iVar3 == 0) {
        if (*local_420 == '/') {
          i._16_8_ = local_420;
        }
        else {
          cert_path[0x3f8] = '/';
          lws_strncpy(cert_path + 0x3f9,local_420,299);
          i._16_8_ = cert_path + 0x3f8;
        }
        iVar3 = strcmp(p,"http");
        if ((iVar3 == 0) || (iVar3 = strcmp(p,"ws"), iVar3 == 0)) {
          rl_dumb = 0;
        }
        iVar3 = strcmp(p,"https");
        if (((iVar3 == 0) || (iVar3 = strcmp(p,"wss"), iVar3 == 0)) && (rl_dumb == 0)) {
          rl_dumb = 1;
        }
        _lws_log(0x10,"\'%s\' %p \'%s\' %p\n",i.context,i.context,i._16_8_,i._16_8_);
        i._unused[3]._0_4_ = 0xffffffff;
        if (((rl_dumb != 0) && ((char)last == '\0')) && (crl_path[0] != '\0')) {
          _lws_log(4,"WARNING, providing a CRL requires a CA cert!\n");
        }
        if ((rl_dumb & 1) == 0) {
          _lws_log(4," SSL disabled\n");
        }
        else {
          _lws_log(4," Using SSL\n");
        }
        if ((rl_dumb & 2) == 0) {
          _lws_log(4," Cert must validate correctly (use -s to allow selfsigned)\n");
        }
        else {
          _lws_log(4," Selfsigned certs allowed\n");
        }
        if ((rl_dumb & 4) == 0) {
          _lws_log(4," Requiring peer cert hostname matches\n");
        }
        else {
          _lws_log(4," Skipping peer cert hostname check\n");
        }
        prot = lws_create_context((lws_context_creation_info *)(i._unused + 3))->canonical_hostname;
        if ((lws_context *)prot != (lws_context *)0x0) {
          i.address._4_4_ = rl_dumb;
          i.path = (i.context)->canonical_hostname;
          i.host = (i.context)->canonical_hostname;
          i.protocol._0_4_ = rl_mirror;
          context = (lws_context *)prot;
          iVar3 = strcmp(p,"http");
          if ((iVar3 == 0) || (iVar3 = strcmp(p,"https"), iVar3 == 0)) {
            _lws_log(4,"using %s mode (non-ws)\n",p);
            if (test_post == 0) {
              i.client_exts = anon_var_dwarf_21a;
            }
            else {
              i.client_exts = anon_var_dwarf_1f8;
              _lws_log(4,"POST mode\n");
            }
            bVar5 = false;
          }
          else {
            iVar3 = strcmp(p,"raw");
            bVar5 = iVar3 != 0;
            if (bVar5) {
              _lws_log(4,"using %s mode (ws)\n",p);
            }
            else {
              i.client_exts = anon_var_dwarf_230;
              i.origin = "lws-test-raw-client";
              _lws_log(4,"using RAW mode connection\n");
            }
          }
          port = 0;
          while (force_exit == 0) {
            if (bVar1) {
              for (ret = 0; ret < 3; ret = ret + 1) {
                if ((wsi_multi[ret] == (lws *)0x0) &&
                   (iVar3 = ratelimit_connects(rl_multi + ret,2), iVar3 != 0)) {
                  _lws_log(4,"dumb %d: connecting\n",(ulong)(uint)ret);
                  i.origin = "dumb-increment-protocol";
                  i.vhost = (lws_vhost *)(wsi_multi + ret);
                  lws_client_connect_via_info((lws_client_connect_info *)&context);
                }
              }
            }
            else if (bVar5) {
              if ((((flag_echo == 0) && (justmirror == 0)) && (wsi_dumb == (lws *)0x0)) &&
                 (iVar3 = ratelimit_connects(&do_ws,2), iVar3 != 0)) {
                _lws_log(4,"dumb: connecting\n");
                i.origin = "dumb-increment-protocol";
                i.vhost = (lws_vhost *)&wsi_dumb;
                lws_client_connect_via_info((lws_client_connect_info *)&context);
              }
              if ((wsi_mirror == (lws *)0x0) && (iVar3 = ratelimit_connects(&pp_secs,2), iVar3 != 0)
                 ) {
                _lws_log(4,"mirror: connecting\n");
                i.origin = "lws-mirror-protocol";
                i.vhost = (lws_vhost *)&wsi_mirror;
                wsi_mirror = lws_client_connect_via_info((lws_client_connect_info *)&context);
              }
            }
            else if ((wsi_dumb == (lws *)0x0) && (iVar3 = ratelimit_connects(&do_ws,2), iVar3 != 0))
            {
              _lws_log(4,"http: connecting\n");
              i.vhost = (lws_vhost *)&wsi_dumb;
              lws_client_connect_via_info((lws_client_connect_info *)&context);
            }
            lws_service((lws_context *)prot,500);
            if ((bVar1) && (port = port + 1, port == 10)) {
              port = 0;
              _lws_log(4,"doing lws_callback_on_writable_all_protocol\n");
              lws_callback_on_writable_all_protocol((lws_context *)prot,protocols);
            }
            if ((flag_echo != 0) && (uVar4 = lws_now_secs(), uVar4 != local_1160)) {
              _lws_log(4,"rxb %d, rx_count %d\n",(ulong)rxb,(ulong)rx_count);
              local_1160 = lws_now_secs();
            }
          }
          _lws_log(1,"Exiting\n");
          lws_context_destroy((lws_context *)prot);
          return use_ssl;
        }
        fprintf(_stderr,"Creating libwebsocket context failed\n");
        return 1;
      }
    }
  }
LAB_0010c942:
  fprintf(_stderr,
          "Usage: libwebsockets-test-client <server address> [--port=<p>] [--ssl] [-k] [-v <ver>] [-d <log bitfield>] [-l]\n"
         );
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
	int n = 0, m, ret = 0, port = 7681, use_ssl = 0, ietf_version = -1;
	unsigned int rl_dumb = 0, rl_mirror = 0, do_ws = 1, pp_secs = 0,
		     do_multi = 0;
	struct lws_context_creation_info info;
	struct lws_client_connect_info i;
	struct lws_context *context;
	const char *prot, *p;
	char path[300];
	char cert_path[1024] = "";
	char key_path[1024] = "";
	char ca_path[1024] = "";
	unsigned long last = lws_now_secs();

	memset(&info, 0, sizeof info);

	lwsl_notice("libwebsockets test client - license MIT\n");
	lwsl_notice("(C) Copyright 2010-2018 Andy Green <andy@warmcat.com>\n");

	if (argc < 2)
		goto usage;

	while (n >= 0) {
#if defined(LWS_HAS_GETOPT_LONG) || defined(WIN32)
       n = getopt_long(argc, argv, "Sjnuv:hsp:d:lC:K:A:P:moeO", options, NULL);
#else
       n = getopt(argc, argv, "Sjnuv:hsp:d:lC:K:A:P:moeO");
#endif
		if (n < 0)
			continue;
		switch (n) {
		case 'd':
			lws_set_log_level(atoi(optarg), NULL);
			break;
		case 's': /* lax SSL, allow selfsigned, skip checking hostname */
			use_ssl = LCCSCF_USE_SSL |
				  LCCSCF_ALLOW_SELFSIGNED |
				  LCCSCF_SKIP_SERVER_CERT_HOSTNAME_CHECK;
			break;
		case 'S': /* Strict SSL, no selfsigned, check server hostname */
			use_ssl = LCCSCF_USE_SSL;
			break;
		case 'p':
			port = atoi(optarg);
			break;
		case 'e':
			flag_echo = 1;
			break;
		case 'P':
			pp_secs = atoi(optarg);
			lwsl_notice("Setting pingpong interval to %d\n", pp_secs);
			break;
		case 'j':
			justmirror = 1;
			break;
		case 'l':
			longlived = 1;
			break;
		case 'v':
			ietf_version = atoi(optarg);
			break;
		case 'u':
			deny_deflate = 1;
			break;
		case 'm':
			do_multi = 1;
			break;
		case 'o':
			test_post = 1;
			break;
		case 'O':
			once = 1;
			break;
		case 'n':
			flag_no_mirror_traffic = 1;
			lwsl_notice("Disabled sending mirror data (for pingpong testing)\n");
			break;
		case 'C':
			lws_strncpy(cert_path, optarg, sizeof(cert_path));
			break;
		case 'K':
			lws_strncpy(key_path, optarg, sizeof(key_path));
			break;
		case 'A':
			lws_strncpy(ca_path, optarg, sizeof(ca_path));
			break;

#if defined(LWS_WITH_TLS) && defined(LWS_HAVE_SSL_CTX_set1_param)
		case 'R':
			lws_strncpy(crl_path, optarg, sizeof(crl_path));
			break;
#endif
		case 'h':
			goto usage;
		}
	}

	if (optind >= argc)
		goto usage;

	signal(SIGINT, sighandler);

	memset(&i, 0, sizeof(i));

	i.port = port;
	if (lws_parse_uri(argv[optind], &prot, &i.address, &i.port, &p))
		goto usage;

	/* add back the leading / on path */
	if (p[0] != '/') {
		path[0] = '/';
		lws_strncpy(path + 1, p, sizeof(path) - 1);
		i.path = path;
	} else
		i.path = p;

	if (!strcmp(prot, "http") || !strcmp(prot, "ws"))
		use_ssl = 0;
	if (!strcmp(prot, "https") || !strcmp(prot, "wss"))
		if (!use_ssl)
			use_ssl = LCCSCF_USE_SSL;

	lwsl_debug("'%s' %p '%s' %p\n", i.address, i.address, i.path, i.path);

	/*
	 * create the websockets context.  This tracks open connections and
	 * knows how to route any traffic and which protocol version to use,
	 * and if each connection is client or server side.
	 *
	 * For this client-only demo, we tell it to not listen on any port.
	 */

	info.port = CONTEXT_PORT_NO_LISTEN;
	info.protocols = protocols;
	info.gid = -1;
	info.uid = -1;
	info.ws_ping_pong_interval = pp_secs;
	info.extensions = exts;

	/*
	 * since we know this lws context is only ever going to be used with
	 * a few client wsis / fds / sockets at a time, let lws know it doesn't
	 * have to use the default allocations for fd tables up to ulimit -n.
	 * It will just allocate for 2 internal and 4 that we might use.
	 */
	info.fd_limit_per_thread = 2 + 4;

#if defined(LWS_WITH_TLS)
	info.options |= LWS_SERVER_OPTION_DO_SSL_GLOBAL_INIT;
#endif

	info.options |= LWS_SERVER_OPTION_H2_JUST_FIX_WINDOW_UPDATE_OVERFLOW;

	if (use_ssl) {
		/*
		 * If the server wants us to present a valid SSL client certificate
		 * then we can set it up here.
		 */

		if (cert_path[0])
			info.client_ssl_cert_filepath = cert_path;
		if (key_path[0])
			info.client_ssl_private_key_filepath = key_path;

		/*
		 * A CA cert and CRL can be used to validate the cert send by the server
		 */
		if (ca_path[0])
			info.client_ssl_ca_filepath = ca_path;

#if defined(LWS_WITH_TLS) && defined(LWS_HAVE_SSL_CTX_set1_param)
		else if (crl_path[0])
			lwsl_notice("WARNING, providing a CRL requires a CA cert!\n");
#endif
	}

	if (use_ssl & LCCSCF_USE_SSL) {
		lwsl_notice(" Using SSL\n");
#if defined(LWS_WITH_MBEDTLS)
		lwsl_notice("   (NOTE: mbedtls needs to be given the remote\n");
		lwsl_notice("    CA cert to trust (with -A) to validate it)\n");
#endif
	}
	else
		lwsl_notice(" SSL disabled\n");
	if (use_ssl & LCCSCF_ALLOW_SELFSIGNED)
		lwsl_notice(" Selfsigned certs allowed\n");
	else
		lwsl_notice(" Cert must validate correctly (use -s to allow selfsigned)\n");
	if (use_ssl & LCCSCF_SKIP_SERVER_CERT_HOSTNAME_CHECK)
		lwsl_notice(" Skipping peer cert hostname check\n");
	else
		lwsl_notice(" Requiring peer cert hostname matches\n");

	context = lws_create_context(&info);
	if (context == NULL) {
		fprintf(stderr, "Creating libwebsocket context failed\n");
		return 1;
	}

	i.context = context;
	i.ssl_connection = use_ssl;
	i.host = i.address;
	i.origin = i.address;
	i.ietf_version_or_minus_one = ietf_version;

	if (!strcmp(prot, "http") || !strcmp(prot, "https")) {
		lwsl_notice("using %s mode (non-ws)\n", prot);
		if (test_post) {
			i.method = "POST";
			lwsl_notice("POST mode\n");
		}
		else
			i.method = "GET";
		do_ws = 0;
	} else
		if (!strcmp(prot, "raw")) {
			i.method = "RAW";
			i.protocol = "lws-test-raw-client";
			lwsl_notice("using RAW mode connection\n");
			do_ws = 0;
		} else
			lwsl_notice("using %s mode (ws)\n", prot);

	/*
	 * sit there servicing the websocket context to handle incoming
	 * packets, and drawing random circles on the mirror protocol websocket
	 *
	 * nothing happens until the client websocket connection is
	 * asynchronously established... calling lws_client_connect() only
	 * instantiates the connection logically, lws_service() progresses it
	 * asynchronously.
	 */

	m = 0;
	while (!force_exit) {

		if (do_multi) {
			for (n = 0; n < (int)LWS_ARRAY_SIZE(wsi_multi); n++) {
				if (!wsi_multi[n] && ratelimit_connects(&rl_multi[n], 2u)) {
					lwsl_notice("dumb %d: connecting\n", n);
					i.protocol = protocols[PROTOCOL_DUMB_INCREMENT].name;
					i.pwsi = &wsi_multi[n];
					lws_client_connect_via_info(&i);
				}
			}
		} else {

			if (do_ws) {
				if (!flag_echo && !justmirror && !wsi_dumb && ratelimit_connects(&rl_dumb, 2u)) {
					lwsl_notice("dumb: connecting\n");
					i.protocol = protocols[PROTOCOL_DUMB_INCREMENT].name;
					i.pwsi = &wsi_dumb;
					lws_client_connect_via_info(&i);
				}

				if (!wsi_mirror && ratelimit_connects(&rl_mirror, 2u)) {
					lwsl_notice("mirror: connecting\n");
					i.protocol = protocols[PROTOCOL_LWS_MIRROR].name;
					i.pwsi = &wsi_mirror;
					wsi_mirror = lws_client_connect_via_info(&i);
				}
			} else
				if (!wsi_dumb && ratelimit_connects(&rl_dumb, 2u)) {
					lwsl_notice("http: connecting\n");
					i.pwsi = &wsi_dumb;
					lws_client_connect_via_info(&i);
				}
		}

		lws_service(context, 500);

		if (do_multi) {
			m++;
			if (m == 10) {
				m = 0;
				lwsl_notice("doing lws_callback_on_writable_all_protocol\n");
				lws_callback_on_writable_all_protocol(context,
					   &protocols[PROTOCOL_DUMB_INCREMENT]);
			}
		}

		if (flag_echo && lws_now_secs() != last) {
			lwsl_notice("rxb %d, rx_count %d\n", rxb, rx_count);
			last = lws_now_secs();
		}
	}

	lwsl_err("Exiting\n");
	lws_context_destroy(context);

	return ret;

usage:
	fprintf(stderr, "Usage: libwebsockets-test-client "
				"<server address> [--port=<p>] "
				"[--ssl] [-k] [-v <ver>] "
				"[-d <log bitfield>] [-l]\n");
	return 1;
}